

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)> * __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>::Iterator::
Clone(Iterator *this)

{
  Iterator *this_00;
  Iterator *in_RDI;
  
  this_00 = (Iterator *)operator_new(0x20);
  Iterator(this_00,in_RDI);
  return &this_00->
          super_ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }